

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType0::AddDataValue(GridDataType0 *this,KUINT8 D)

{
  undefined1 *puVar1;
  value_type_conflict local_1;
  
  puVar1 = &(this->super_GridData).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->m_vui8DataVals,&local_1);
  return;
}

Assistant:

void GridDataType0::AddDataValue( KUINT8 D )
{
    ++m_ui16NumBytes;
    m_vui8DataVals.push_back( D );
}